

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O3

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenerateNestedVerifierTypes_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,Type *type)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  string string_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  GenType_abi_cxx11_(&local_30,this,type,false);
  if (type->base_type - BASE_TYPE_UTYPE < 0xc) {
LAB_002f30fe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_30._M_dataplus._M_p,
               local_30._M_dataplus._M_p + local_30._M_string_length);
  }
  else {
    if (type->base_type == BASE_TYPE_STRING) {
      std::operator+(&local_50,"ForwardOffset<",&local_30);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    }
    else {
      if ((type->struct_def != (StructDef *)0x0) && (type->struct_def->fixed == true))
      goto LAB_002f30fe;
      std::operator+(&local_50,"ForwardOffset<",&local_30);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateNestedVerifierTypes(const Type &type) {
    const auto string_type = GenType(type);

    if (IsScalar(type.base_type)) { return string_type; }

    if (IsString(type)) { return "ForwardOffset<" + string_type + ">"; }

    if (type.struct_def && type.struct_def->fixed) { return string_type; }

    return "ForwardOffset<" + string_type + ">";
  }